

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmq_addon.hpp
# Opt level: O0

void zmq::detail::write_network_order(uchar *buf,uint32_t value)

{
  bool bVar1;
  uint32_t mask;
  uint32_t value_local;
  uchar *buf_local;
  
  bVar1 = is_little_endian();
  if (bVar1) {
    *buf = (uchar)(value >> 0x18);
    buf[1] = (uchar)(value >> 0x10);
    buf[2] = (uchar)(value >> 8);
    buf[3] = (uchar)value;
  }
  else {
    *(uint32_t *)buf = value;
  }
  return;
}

Assistant:

inline void write_network_order(unsigned char *buf, const uint32_t value)
{
    if (is_little_endian()) {
        ZMQ_CONSTEXPR_VAR uint32_t mask = (std::numeric_limits<std::uint8_t>::max)();
        *buf++ = static_cast<unsigned char>((value >> 24) & mask);
        *buf++ = static_cast<unsigned char>((value >> 16) & mask);
        *buf++ = static_cast<unsigned char>((value >> 8) & mask);
        *buf++ = static_cast<unsigned char>(value & mask);
    } else {
        std::memcpy(buf, &value, sizeof(value));
    }
}